

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

int __thiscall Fl_Input_::line_end(Fl_Input_ *this,int i)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  char buf [1024];
  wchar_t local_438 [258];
  
  bVar1 = (this->super_Fl_Widget).type_;
  if ((bVar1 & 7) == 4) {
    uVar8 = (ulong)(uint)i;
    if ((bVar1 & 0x10) == 0) {
      uVar5 = (ulong)(uint)this->size_;
      if (i < this->size_) {
        uVar8 = (ulong)i;
        do {
          local_438[0] = L'\0';
          uVar3 = fl_utf8decode(this->value_ + uVar8,this->value_ + (int)uVar5,local_438);
          if (uVar3 == 10) break;
          uVar8 = uVar8 + 1;
          uVar5 = (ulong)this->size_;
        } while ((long)uVar8 < (long)uVar5);
      }
    }
    else {
      lVar7 = (long)i;
      uVar3 = i + 1;
      do {
        uVar9 = i >> 0x1f & i;
        if (lVar7 < 1) break;
        local_438[0] = L'\0';
        lVar2 = lVar7 + -1;
        lVar7 = lVar7 + -1;
        uVar4 = fl_utf8decode(this->value_ + lVar2,this->value_ + this->size_,local_438);
        uVar3 = uVar3 - 1;
        uVar9 = uVar3;
      } while (uVar4 != 10);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
                (fl_graphics_driver,(ulong)(uint)this->textfont_,(ulong)(uint)this->textsize_);
      pcVar6 = this->value_ + (int)uVar9;
      do {
        pcVar6 = expand(this,pcVar6,(char *)local_438);
        uVar3 = (int)pcVar6 - *(int *)&this->value_;
        pcVar6 = pcVar6 + ((int)uVar3 < i);
      } while ((int)uVar3 < i);
      uVar8 = (ulong)uVar3;
    }
  }
  else {
    uVar8 = (ulong)(uint)this->size_;
  }
  return (int)uVar8;
}

Assistant:

int Fl_Input_::line_end(int i) const {
  if (input_type() != FL_MULTILINE_INPUT) return size();

  if (wrap()) {
    // go to the start of the paragraph:
    int j = i;
    while (j > 0 && index(j-1) != '\n') j--;
    // now measure lines until we get past i, end of that line is real eol:
    setfont();
    for (const char* p=value()+j; ;) {
      char buf[MAXBUF];
      p = expand(p, buf);
      int k = (int) (p-value());
      if (k >= i) return k;
      p++;
    }
  } else {
    while (i < size() && index(i) != '\n') i++;
    return i;
  }
}